

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

bool CompileTypemask(SQIntVec *res,SQChar *typemask)

{
  char cVar1;
  long lVar2;
  ulong local_30;
  
  local_30 = 0;
  lVar2 = 0;
  do {
    while( true ) {
      lVar2 = lVar2 + 2;
      while( true ) {
        cVar1 = typemask[lVar2 + -2];
        if (cVar1 == '\0') goto switchD_00118b30_caseD_64;
        if (cVar1 != ' ') break;
        lVar2 = lVar2 + 1;
      }
      switch(cVar1) {
      case 'a':
        local_30 = local_30 | 0x40;
        break;
      case 'b':
        local_30 = local_30 | 8;
        break;
      case 'c':
        local_30 = local_30 | 0x300;
        break;
      case 'd':
      case 'e':
      case 'h':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'q':
      case 'w':
        goto switchD_00118b30_caseD_64;
      case 'f':
        local_30 = local_30 | 4;
        break;
      case 'g':
        local_30 = local_30 | 0x400;
        break;
      case 'i':
        local_30 = local_30 | 2;
        break;
      case 'n':
        local_30 = local_30 | 6;
        break;
      case 'o':
        local_30 = local_30 | 1;
        break;
      case 'p':
        local_30 = local_30 | 0x800;
        break;
      case 'r':
        local_30 = local_30 | 0x10000;
        break;
      case 's':
        local_30 = local_30 | 0x10;
        break;
      case 't':
        local_30 = local_30 | 0x20;
        break;
      case 'u':
        local_30 = local_30 | 0x80;
        break;
      case 'v':
        local_30 = local_30 | 0x1000;
        break;
      case 'x':
        local_30 = local_30 | 0x8000;
        break;
      case 'y':
        local_30 = local_30 | 0x4000;
        break;
      default:
        if (cVar1 == '.') {
          local_30 = 0xffffffffffffffff;
          sqvector<long_long>::push_back(res,(longlong *)&local_30);
          goto LAB_00118bed;
        }
        goto switchD_00118b30_caseD_64;
      }
      if (typemask[lVar2 + -1] == '|') break;
      sqvector<long_long>::push_back(res,(longlong *)&local_30);
LAB_00118bed:
      lVar2 = lVar2 + -1;
      local_30 = 0;
    }
  } while (typemask[lVar2] != '\0');
switchD_00118b30_caseD_64:
  return cVar1 == '\0';
}

Assistant:

bool CompileTypemask(SQIntVec &res,const SQChar *typemask)
{
    SQInteger i = 0;
    SQInteger mask = 0;
    while(typemask[i] != 0) {
        switch(typemask[i]) {
            case 'o': mask |= _RT_NULL; break;
            case 'i': mask |= _RT_INTEGER; break;
            case 'f': mask |= _RT_FLOAT; break;
            case 'n': mask |= (_RT_FLOAT | _RT_INTEGER); break;
            case 's': mask |= _RT_STRING; break;
            case 't': mask |= _RT_TABLE; break;
            case 'a': mask |= _RT_ARRAY; break;
            case 'u': mask |= _RT_USERDATA; break;
            case 'c': mask |= (_RT_CLOSURE | _RT_NATIVECLOSURE); break;
            case 'b': mask |= _RT_BOOL; break;
            case 'g': mask |= _RT_GENERATOR; break;
            case 'p': mask |= _RT_USERPOINTER; break;
            case 'v': mask |= _RT_THREAD; break;
            case 'x': mask |= _RT_INSTANCE; break;
            case 'y': mask |= _RT_CLASS; break;
            case 'r': mask |= _RT_WEAKREF; break;
            case '.': mask = -1; res.push_back(mask); i++; mask = 0; continue;
            case ' ': i++; continue; //ignores spaces
            default:
                return false;
        }
        i++;
        if(typemask[i] == '|') {
            i++;
            if(typemask[i] == 0)
                return false;
            continue;
        }
        res.push_back(mask);
        mask = 0;

    }
    return true;
}